

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,REF_CLOUD *one_layer,REF_NODE ref_node)

{
  REF_GLOB RVar1;
  uint uVar2;
  int iVar3;
  REF_CLOUD pRVar4;
  REF_GLOB *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  REF_GLOB RVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  REF_INT local_pivot;
  REF_NODE local_68;
  REF_CLOUD copy;
  REF_DBL xyzs [4];
  
  uVar2 = ref_cloud_deep_copy(&copy,ref_cloud);
  if (uVar2 != 0) {
    uVar6 = (ulong)uVar2;
    pcVar11 = "copy";
    uVar7 = 0x3a6;
LAB_001b25fb:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
           "ref_recon_grow_cloud_one_layer",uVar6,pcVar11);
    return (REF_STATUS)uVar6;
  }
  iVar3 = copy->n;
  RVar1 = -1;
  if (iVar3 < 1) {
    lVar8 = 0;
    RVar9 = RVar1;
    local_68 = ref_node;
    goto LAB_001b24ec;
  }
  pRVar5 = copy->global;
  lVar8 = 0;
  do {
    RVar9 = *pRVar5;
    local_68 = ref_node;
LAB_001b24ec:
    do {
      if (iVar3 <= lVar8) {
        ref_cloud_free(copy);
        return 0;
      }
      uVar2 = ref_node_local(local_68,RVar9,&local_pivot);
      if (uVar2 == 0) {
        pRVar4 = one_layer[local_pivot];
        iVar3 = pRVar4->n;
        if (iVar3 < 1) {
          lVar12 = 0;
          RVar9 = RVar1;
          goto LAB_001b2562;
        }
        pRVar5 = pRVar4->global;
        lVar12 = 0;
        do {
          RVar9 = *pRVar5;
LAB_001b2562:
          do {
            if (iVar3 <= lVar12) goto LAB_001b2529;
            uVar2 = pRVar4->naux;
            uVar6 = 0;
            if (0 < (int)uVar2) {
              uVar6 = (ulong)uVar2;
            }
            for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
              xyzs[uVar10] = pRVar4->aux[(long)(int)((int)lVar12 * uVar2) + uVar10];
            }
            uVar2 = ref_cloud_store(ref_cloud,RVar9,xyzs);
            if (uVar2 != 0) {
              uVar6 = (ulong)uVar2;
              pcVar11 = "store stencil increase";
              uVar7 = 0x3b3;
              goto LAB_001b25fb;
            }
            lVar12 = lVar12 + 1;
            pRVar4 = one_layer[local_pivot];
            iVar3 = pRVar4->n;
            RVar9 = RVar1;
          } while (iVar3 <= (int)lVar12);
          pRVar5 = pRVar4->global + lVar12;
        } while( true );
      }
      uVar6 = (ulong)uVar2;
      if (uVar2 != 5) {
        pcVar11 = "local search";
        uVar7 = 0x3ad;
        goto LAB_001b25fb;
      }
      printf("global %ld not found\n",RVar9);
LAB_001b2529:
      lVar8 = lVar8 + 1;
      iVar3 = copy->n;
      RVar9 = RVar1;
    } while (iVar3 <= (int)lVar8);
    pRVar5 = copy->global + lVar8;
    ref_node = local_68;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,
                                                         REF_CLOUD *one_layer,
                                                         REF_NODE ref_node) {
  REF_CLOUD copy;
  REF_STATUS ref_status;
  REF_INT pivot_index, local_pivot;
  REF_INT add_index, i;
  REF_GLOB global, global_pivot;
  REF_DBL xyzs[4];
  RSS(ref_cloud_deep_copy(&copy, ref_cloud), "copy");
  each_ref_cloud_global(copy, pivot_index, global_pivot) {
    ref_status = ref_node_local(ref_node, global_pivot, &local_pivot);
    if (REF_NOT_FOUND == ref_status) {
      printf("global %ld not found\n", global_pivot);
      continue;
    } else {
      RSS(ref_status, "local search");
    }
    each_ref_cloud_global(one_layer[local_pivot], add_index, global) {
      each_ref_cloud_aux(one_layer[local_pivot], i) {
        xyzs[i] = ref_cloud_aux(one_layer[local_pivot], i, add_index);
      }
      RSS(ref_cloud_store(ref_cloud, global, xyzs), "store stencil increase");
    }
  }
  ref_cloud_free(copy);

  return REF_SUCCESS;
}